

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O3

int __thiscall Heuristics::evaluateStateBestFirst(Heuristics *this,Table currentState)

{
  Cell *this_00;
  int iVar1;
  short sVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Table *pTVar8;
  int j;
  long lVar9;
  int i;
  long lVar10;
  
  lVar10 = 0;
  pTVar8 = &currentState;
  iVar5 = 0;
  do {
    lVar9 = 0;
    do {
      this_00 = pTVar8->table[0] + lVar9;
      cVar3 = Cell::getNumber(this_00);
      if (cVar3 != ' ') {
        cVar3 = Cell::getNumber(this_00);
        iVar4 = cVar3 + -0x31;
        uVar6 = (((uint)(iVar4 * 0x5555) >> 0x10) - (int)cVar3) + 0x31;
        iVar7 = (int)(short)(((short)uVar6 >> 1) + (short)((uVar6 & 0xffff) >> 0xf)) + (int)lVar10;
        iVar1 = -iVar7;
        if (0 < iVar7) {
          iVar1 = iVar7;
        }
        sVar2 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
        iVar7 = (int)lVar9 - (int)(short)((short)cVar3 + (sVar2 - (sVar2 >> 0xf)) * -3 + -0x31);
        iVar4 = -iVar7;
        if (0 < iVar7) {
          iVar4 = iVar7;
        }
        iVar5 = iVar4 + iVar5 + iVar1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar10 = lVar10 + 1;
    pTVar8 = (Table *)(pTVar8->table + 1);
  } while (lVar10 != 3);
  return iVar5;
}

Assistant:

int Heuristics::evaluateStateBestFirst(Table currentState) {
    int distance = 0;
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
        }
    }
    return distance;
}